

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void HE16_SSE2(uint8_t *dst,uint8_t *left)

{
  uint8_t uVar1;
  __m128i values;
  int j;
  uint8_t *left_local;
  uint8_t *dst_local;
  undefined8 local_8;
  
  left_local = dst;
  for (values[1]._4_4_ = 0; values[1]._4_4_ < 0x10; values[1]._4_4_ = values[1]._4_4_ + 1) {
    uVar1 = left[values[1]._4_4_];
    local_8 = CONCAT71(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(uVar1,uVar1),uVar1),
                                                           uVar1),uVar1),uVar1),uVar1),uVar1);
    *(ulong *)left_local =
         CONCAT17(uVar1,CONCAT16(uVar1,CONCAT15(uVar1,CONCAT14(uVar1,CONCAT13(uVar1,CONCAT12(uVar1,
                                                  CONCAT11(uVar1,uVar1)))))));
    *(undefined8 *)(left_local + 8) = local_8;
    left_local = left_local + 0x20;
  }
  return;
}

Assistant:

static void HE16_SSE2(uint8_t* dst) {     // horizontal
  int j;
  for (j = 16; j > 0; --j) {
    const __m128i values = _mm_set1_epi8((char)dst[-1]);
    _mm_storeu_si128((__m128i*)dst, values);
    dst += BPS;
  }
}